

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O3

zarray_t * apriltag_detector_detect(apriltag_detector_t *td,image_u8_t *im_orig)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  timeprofile_t *ptVar11;
  size_t sVar12;
  size_t sVar13;
  bool bVar14;
  double dVar15;
  undefined8 uVar16;
  int iVar17;
  workerpool_t *pwVar18;
  int64_t iVar19;
  image_u8_t *piVar20;
  zarray_t *pzVar21;
  long lVar22;
  zarray_t *polyb;
  matd_t *pmVar23;
  FILE *__stream;
  image_u8_t *piVar24;
  image_u8x3_t *im;
  long lVar25;
  uint uVar26;
  char *pcVar27;
  int i_2;
  zarray_t *pzVar28;
  apriltag_detection_t *paVar29;
  int32_t iVar30;
  ulong uVar31;
  long lVar32;
  apriltag_detection_t *paVar33;
  long lVar34;
  double (*__src) [2];
  apriltag_detector_t *paVar35;
  int iVar36;
  int i_1;
  uint uVar37;
  int iVar38;
  int i;
  int *p;
  void *__src_00;
  double *pdVar39;
  char acVar40 [8];
  float fVar41;
  float fVar42;
  double dVar43;
  double dVar44;
  float fVar45;
  code *local_d0;
  undefined1 auStack_c8 [24];
  matd_t *local_b0;
  uint local_a4;
  apriltag_detection_t *local_a0;
  apriltag_detection_t *det1;
  matd_t *local_90;
  image_u8_t *local_88;
  apriltag_detector_t *local_80;
  zarray_t *local_78;
  uint8_t local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined8 uStack_68;
  apriltag_detection_t *det0;
  undefined8 local_58;
  undefined8 uStack_50;
  int64_t local_48;
  char local_40 [8];
  zarray_t *local_38;
  
  if (td->tag_families == (zarray_t *)0x0) goto LAB_0010b372;
  if (td->tag_families->size == 0) {
    local_d0 = (code *)0x109d74;
    pzVar21 = (zarray_t *)calloc(1,0x18);
    pzVar21->el_sz = 8;
    local_d0 = (code *)0x109d8c;
    printf("apriltag.c: No tag families enabled.");
    return pzVar21;
  }
  if (td->wp == (workerpool_t *)0x0) {
    pwVar18 = (workerpool_t *)0x0;
LAB_00109d93:
    local_d0 = (code *)0x109d98;
    workerpool_destroy(pwVar18);
    local_d0 = (code *)0x109da1;
    pwVar18 = workerpool_create(td->nthreads);
    td->wp = pwVar18;
  }
  else {
    iVar38 = td->nthreads;
    local_d0 = (code *)0x109d5a;
    iVar17 = workerpool_get_nthreads(td->wp);
    if (iVar38 != iVar17) {
      pwVar18 = td->wp;
      goto LAB_00109d93;
    }
  }
  ptVar11 = td->tp;
  pzVar21 = ptVar11->stamps;
  if (pzVar21 == (zarray_t *)0x0) {
    local_d0 = quad_decode_task;
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0x183,"void zarray_clear(zarray_t *)");
  }
  pzVar21->size = 0;
  local_d0 = (code *)0x109dc6;
  iVar19 = utime_now();
  ptVar11->utime = iVar19;
  ptVar11 = td->tp;
  local_58 = 0;
  uStack_68._0_1_ = 'i';
  uStack_68._1_1_ = 'n';
  uStack_68._2_1_ = 'i';
  uStack_68._3_1_ = 't';
  uStack_68._4_1_ = '\0';
  uStack_68._5_1_ = '\0';
  uStack_68._6_1_ = '\0';
  uStack_68._7_1_ = '\0';
  det0 = (apriltag_detection_t *)0x0;
  uStack_50 = 0;
  local_d0 = (code *)0x109def;
  local_48 = utime_now();
  pzVar21 = ptVar11->stamps;
  paVar29 = (apriltag_detection_t *)auStack_c8;
  if (pzVar21 != (zarray_t *)0x0) {
    iVar38 = pzVar21->size;
    iVar17 = pzVar21->alloc;
    if (iVar38 < iVar17) {
      pcVar27 = pzVar21->data;
    }
    else {
      do {
        bVar14 = iVar17 < 4;
        iVar17 = iVar17 * 2;
        if (bVar14) {
          iVar17 = 8;
        }
      } while (iVar17 <= iVar38);
      pzVar21->alloc = iVar17;
      local_d0 = (code *)0x109e35;
      pcVar27 = (char *)realloc(pzVar21->data,(long)iVar17 * pzVar21->el_sz);
      pzVar21->data = pcVar27;
      iVar38 = pzVar21->size;
    }
    local_d0 = (code *)0x109e52;
    memcpy(pcVar27 + (long)iVar38 * pzVar21->el_sz,&uStack_68,pzVar21->el_sz);
    pzVar21->size = pzVar21->size + 1;
    piVar20 = im_orig;
    if (1.0 < td->quad_decimate) {
      local_d0 = (code *)0x109e74;
      piVar20 = image_u8_decimate(im_orig,td->quad_decimate);
      ptVar11 = td->tp;
      local_58 = 0;
      uStack_68._0_1_ = 'd';
      uStack_68._1_1_ = 'e';
      uStack_68._2_1_ = 'c';
      uStack_68._3_1_ = 'i';
      uStack_68._4_1_ = 'm';
      uStack_68._5_1_ = 'a';
      uStack_68._6_1_ = 't';
      uStack_68._7_1_ = 'e';
      det0 = (apriltag_detection_t *)0x0;
      uStack_50 = 0;
      local_d0 = (code *)0x109e9d;
      local_48 = utime_now();
      pzVar21 = ptVar11->stamps;
      paVar29 = (apriltag_detection_t *)auStack_c8;
      if (pzVar21 == (zarray_t *)0x0) goto LAB_0010b353;
      iVar38 = pzVar21->size;
      iVar17 = pzVar21->alloc;
      if (iVar38 < iVar17) {
        pcVar27 = pzVar21->data;
      }
      else {
        do {
          bVar14 = iVar17 < 4;
          iVar17 = iVar17 * 2;
          if (bVar14) {
            iVar17 = 8;
          }
        } while (iVar17 <= iVar38);
        pzVar21->alloc = iVar17;
        local_d0 = (code *)0x109ee3;
        pcVar27 = (char *)realloc(pzVar21->data,(long)iVar17 * pzVar21->el_sz);
        pzVar21->data = pcVar27;
        iVar38 = pzVar21->size;
      }
      local_d0 = (code *)0x109f00;
      memcpy(pcVar27 + (long)iVar38 * pzVar21->el_sz,&uStack_68,pzVar21->el_sz);
      pzVar21->size = pzVar21->size + 1;
    }
    fVar45 = td->quad_sigma;
    if ((fVar45 != 0.0) || (NAN(fVar45))) {
      uVar37 = (int)(ABS(fVar45) * 4.0) | 1;
      if (1 < (int)uVar37) {
        acVar40 = (char  [8])(double)ABS(fVar45);
        if (fVar45 <= 0.0) {
          local_d0 = (code *)0x109f6a;
          local_40 = acVar40;
          piVar24 = image_u8_copy(piVar20);
          local_d0 = (code *)0x109f7d;
          image_u8_gaussian_blur(piVar20,(double)local_40,uVar37);
          iVar38 = piVar24->height;
          if (0 < iVar38) {
            iVar30 = piVar24->width;
            iVar17 = 0;
            do {
              if (0 < iVar30) {
                lVar32 = 0;
                do {
                  lVar22 = (long)piVar20->stride * (long)iVar17;
                  iVar38 = (uint)piVar24->buf[lVar32 + (long)piVar24->stride * (long)iVar17] * 2 -
                           (uint)piVar20->buf[lVar32 + lVar22];
                  if (iVar38 < 1) {
                    iVar38 = 0;
                  }
                  if (0xfe < iVar38) {
                    iVar38 = 0xff;
                  }
                  piVar20->buf[lVar32 + lVar22] = (uint8_t)iVar38;
                  iVar30 = piVar24->width;
                  lVar32 = lVar32 + 1;
                } while ((int)lVar32 < iVar30);
                iVar38 = piVar24->height;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 < iVar38);
          }
          local_d0 = (code *)0x109feb;
          image_u8_destroy(piVar24);
        }
        else {
          local_d0 = (code *)0x109f5b;
          image_u8_gaussian_blur(piVar20,(double)acVar40,uVar37);
        }
      }
    }
    ptVar11 = td->tp;
    local_58 = 0;
    uStack_68._0_1_ = 'b';
    uStack_68._1_1_ = 'l';
    uStack_68._2_1_ = 'u';
    uStack_68._3_1_ = 'r';
    uStack_68._4_1_ = '/';
    uStack_68._5_1_ = 's';
    uStack_68._6_1_ = 'h';
    uStack_68._7_1_ = 'a';
    det0 = (apriltag_detection_t *)0x7072;
    uStack_50 = 0;
    local_d0 = (code *)0x10a011;
    local_48 = utime_now();
    pzVar21 = ptVar11->stamps;
    paVar29 = (apriltag_detection_t *)auStack_c8;
    if (pzVar21 == (zarray_t *)0x0) goto LAB_0010b353;
    iVar38 = pzVar21->size;
    iVar17 = pzVar21->alloc;
    if (iVar38 < iVar17) {
      pcVar27 = pzVar21->data;
    }
    else {
      do {
        bVar14 = iVar17 < 4;
        iVar17 = iVar17 * 2;
        if (bVar14) {
          iVar17 = 8;
        }
      } while (iVar17 <= iVar38);
      pzVar21->alloc = iVar17;
      local_d0 = (code *)0x10a057;
      pcVar27 = (char *)realloc(pzVar21->data,(long)iVar17 * pzVar21->el_sz);
      pzVar21->data = pcVar27;
      iVar38 = pzVar21->size;
    }
    local_d0 = (code *)0x10a074;
    memcpy(pcVar27 + (long)iVar38 * pzVar21->el_sz,&uStack_68,pzVar21->el_sz);
    pzVar21->size = pzVar21->size + 1;
    if (td->debug != 0) {
      local_d0 = (code *)0x10a08e;
      image_u8_write_pnm(piVar20,"debug_preprocess.pnm");
    }
    local_d0 = (code *)0x10a099;
    local_38 = apriltag_quad_thresh(td,piVar20);
    if (1.0 < td->quad_decimate) {
      if (local_38 == (zarray_t *)0x0) goto LAB_0010b372;
      uVar37 = local_38->size;
      if (0 < (int)uVar37) {
        sVar12 = local_38->el_sz;
        pcVar27 = local_38->data + 4;
        uVar31 = 0;
        do {
          lVar32 = 0;
          do {
            fVar45 = td->quad_decimate;
            if ((fVar45 != 1.5) || (NAN(fVar45))) {
              *(float *)(pcVar27 + lVar32 * 8 + -4) =
                   (*(float *)(pcVar27 + lVar32 * 8 + -4) + -0.5) * fVar45 + 0.5;
              fVar45 = td->quad_decimate * (*(float *)(pcVar27 + lVar32 * 8) + -0.5) + 0.5;
            }
            else {
              *(float *)(pcVar27 + lVar32 * 8 + -4) = *(float *)(pcVar27 + lVar32 * 8 + -4) * 1.5;
              fVar45 = td->quad_decimate * *(float *)(pcVar27 + lVar32 * 8);
            }
            *(float *)(pcVar27 + lVar32 * 8) = fVar45;
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          uVar31 = uVar31 + 1;
          pcVar27 = pcVar27 + sVar12;
        } while (uVar31 != uVar37);
      }
    }
    if (piVar20 != im_orig) {
      local_d0 = (code *)0x10a19e;
      image_u8_destroy(piVar20);
    }
    local_d0 = (code *)0x10a1ad;
    pzVar21 = (zarray_t *)calloc(1,0x18);
    pzVar21->el_sz = 8;
    if (local_38 == (zarray_t *)0x0) {
LAB_0010b372:
      local_d0 = (code *)0x10b391;
      __assert_fail("za != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                    ,0x84,"int zarray_size(const zarray_t *)");
    }
    td->nquads = local_38->size;
    ptVar11 = td->tp;
    local_58 = 0;
    uStack_68._0_1_ = 'q';
    uStack_68._1_1_ = 'u';
    uStack_68._2_1_ = 'a';
    uStack_68._3_1_ = 'd';
    uStack_68._4_1_ = 's';
    uStack_68._5_1_ = '\0';
    uStack_68._6_1_ = '\0';
    uStack_68._7_1_ = '\0';
    det0 = (apriltag_detection_t *)0x0;
    uStack_50 = 0;
    local_d0 = (code *)0x10a1f2;
    local_48 = utime_now();
    pzVar28 = ptVar11->stamps;
    paVar29 = (apriltag_detection_t *)auStack_c8;
    if (pzVar28 != (zarray_t *)0x0) {
      iVar38 = pzVar28->size;
      iVar17 = pzVar28->alloc;
      if (iVar38 < iVar17) {
        pcVar27 = pzVar28->data;
      }
      else {
        do {
          bVar14 = iVar17 < 4;
          iVar17 = iVar17 * 2;
          if (bVar14) {
            iVar17 = 8;
          }
        } while (iVar17 <= iVar38);
        pzVar28->alloc = iVar17;
        local_d0 = (code *)0x10a238;
        pcVar27 = (char *)realloc(pzVar28->data,(long)iVar17 * pzVar28->el_sz);
        pzVar28->data = pcVar27;
        iVar38 = pzVar28->size;
      }
      local_d0 = (code *)0x10a259;
      local_78 = pzVar21;
      memcpy(pcVar27 + (long)iVar38 * pzVar28->el_sz,&uStack_68,pzVar28->el_sz);
      pzVar28->size = pzVar28->size + 1;
      local_88 = im_orig;
      local_80 = td;
      if (td->debug == 0) {
        acVar40[0] = '\0';
        acVar40[1] = '\0';
        acVar40[2] = '\0';
        acVar40[3] = '\0';
        acVar40[4] = '\0';
        acVar40[5] = '\0';
        acVar40[6] = '\0';
        acVar40[7] = '\0';
        pzVar21 = local_38;
      }
      else {
        local_d0 = (code *)0x10a278;
        piVar20 = image_u8_copy(im_orig);
        local_d0 = (code *)0x10a283;
        image_u8_darken(piVar20);
        local_d0 = (code *)0x10a28b;
        image_u8_darken(piVar20);
        local_d0 = (code *)0x10a292;
        srandom(0);
        pzVar21 = local_38;
        if (0 < local_38->size) {
          lVar32 = 0;
          do {
            pcVar27 = local_38->data;
            lVar34 = local_38->el_sz * lVar32;
            local_d0 = (code *)0x10a2bc;
            lVar22 = random();
            iVar38 = (int)lVar22 +
                     ((int)(SUB168(SEXT816(lVar22) * SEXT816(0x69b4069b4069b407),8) >> 6) -
                     (SUB164(SEXT816(lVar22) * SEXT816(0x69b4069b4069b407),0xc) >> 0x1f)) * -0x9b +
                     100;
            local_d0 = (code *)0x10a312;
            image_u8_draw_line(piVar20,*(float *)(pcVar27 + lVar34),*(float *)(pcVar27 + lVar34 + 4)
                               ,*(float *)(pcVar27 + lVar34 + 8),*(float *)(pcVar27 + lVar34 + 0xc),
                               iVar38,1);
            local_d0 = (code *)0x10a33e;
            image_u8_draw_line(piVar20,*(float *)(pcVar27 + lVar34 + 8),
                               *(float *)(pcVar27 + lVar34 + 0xc),
                               *(float *)(pcVar27 + lVar34 + 0x10),
                               *(float *)(pcVar27 + lVar34 + 0x14),iVar38,1);
            local_d0 = (code *)0x10a36a;
            image_u8_draw_line(piVar20,*(float *)(pcVar27 + lVar34 + 0x10),
                               *(float *)(pcVar27 + lVar34 + 0x14),
                               *(float *)(pcVar27 + lVar34 + 0x18),
                               *(float *)(pcVar27 + lVar34 + 0x1c),iVar38,1);
            pzVar21 = local_38;
            local_d0 = (code *)0x10a39a;
            image_u8_draw_line(piVar20,*(float *)(pcVar27 + lVar34 + 0x18),
                               *(float *)(pcVar27 + lVar34 + 0x1c),*(float *)(pcVar27 + lVar34),
                               *(float *)(pcVar27 + lVar34 + 4),iVar38,1);
            lVar32 = lVar32 + 1;
          } while (lVar32 < pzVar21->size);
        }
        local_d0 = (code *)0x10a3b9;
        image_u8_write_pnm(piVar20,"debug_quads_raw.pnm");
        local_d0 = (code *)0x10a3c1;
        image_u8_destroy(piVar20);
        td = local_80;
        if (local_80->debug == 0) {
          acVar40[0] = '\0';
          acVar40[1] = '\0';
          acVar40[2] = '\0';
          acVar40[3] = '\0';
          acVar40[4] = '\0';
          acVar40[5] = '\0';
          acVar40[6] = '\0';
          acVar40[7] = '\0';
        }
        else {
          local_d0 = (code *)0x10a3d6;
          acVar40 = (char  [8])image_u8_copy(local_88);
        }
      }
      pzVar28 = local_78;
      piVar20 = local_88;
      iVar17 = pzVar21->size / (td->nthreads * 10) + 1;
      lVar32 = (ulong)(pzVar21->size / iVar17 + 1) * -0x30;
      p = (int *)(auStack_c8 + lVar32);
      iVar38 = pzVar21->size;
      det1 = (apriltag_detection_t *)auStack_c8;
      if (0 < iVar38) {
        iVar36 = 0;
        local_90 = (matd_t *)CONCAT44(local_90._4_4_,iVar17);
        det1 = (apriltag_detection_t *)auStack_c8;
        local_40 = acVar40;
        do {
          acVar40 = local_40;
          *p = iVar36;
          iVar36 = iVar36 + iVar17;
          if (iVar36 <= iVar38) {
            iVar38 = iVar36;
          }
          p[1] = iVar38;
          *(zarray_t **)(p + 2) = pzVar21;
          *(apriltag_detector_t **)(p + 4) = td;
          *(image_u8_t **)(p + 6) = piVar20;
          *(zarray_t **)(p + 8) = pzVar28;
          *(char (*) [8])(p + 10) = acVar40;
          pwVar18 = td->wp;
          *(undefined8 *)(auStack_c8 + lVar32 + -8) = 0x10a479;
          workerpool_add_task(pwVar18,quad_decode_task,p);
          iVar38 = pzVar21->size;
          p = p + 0xc;
          acVar40 = local_40;
          td = local_80;
          iVar17 = (int)local_90;
        } while (iVar36 < iVar38);
      }
      pwVar18 = td->wp;
      *(undefined8 *)(auStack_c8 + lVar32 + -8) = 0x10a4a4;
      workerpool_run(pwVar18);
      if (acVar40 != (char  [8])0x0) {
        *(undefined8 *)(auStack_c8 + lVar32 + -8) = 0x10a4b8;
        image_u8_write_pnm((image_u8_t *)acVar40,"debug_samples.pnm");
        *(undefined8 *)(auStack_c8 + lVar32 + -8) = 0x10a4c0;
        image_u8_destroy((image_u8_t *)acVar40);
      }
      pzVar21 = local_38;
      piVar20 = local_88;
      paVar29 = det1;
      if (td->debug != 0) {
        det1[-1].p[3][1] = 5.38918901433298e-318;
        piVar20 = image_u8_copy(piVar20);
        paVar29[-1].p[3][1] = 5.38924336155403e-318;
        image_u8_darken(piVar20);
        paVar29[-1].p[3][1] = 5.38928288680569e-318;
        image_u8_darken(piVar20);
        paVar29[-1].p[3][1] = 5.3893174714009e-318;
        srandom(0);
        if (0 < pzVar21->size) {
          lVar32 = 0;
          do {
            pcVar27 = local_38->data;
            lVar34 = local_38->el_sz * lVar32;
            paVar29[-1].p[3][1] = 5.38950521634632e-318;
            lVar22 = random();
            iVar38 = (int)lVar22 +
                     ((int)(SUB168(SEXT816(lVar22) * SEXT816(0x69b4069b4069b407),8) >> 6) -
                     (SUB164(SEXT816(lVar22) * SEXT816(0x69b4069b4069b407),0xc) >> 0x1f)) * -0x9b +
                     100;
            fVar45 = *(float *)(pcVar27 + lVar34);
            fVar41 = *(float *)(pcVar27 + lVar34 + 4);
            fVar42 = *(float *)(pcVar27 + lVar34 + 8);
            fVar1 = *(float *)(pcVar27 + lVar34 + 0xc);
            paVar29[-1].p[3][1] = 5.38993011280174e-318;
            image_u8_draw_line(piVar20,fVar45,fVar41,fVar42,fVar1,iVar38,1);
            fVar45 = *(float *)(pcVar27 + lVar34 + 8);
            fVar41 = *(float *)(pcVar27 + lVar34 + 0xc);
            fVar42 = *(float *)(pcVar27 + lVar34 + 0x10);
            fVar1 = *(float *)(pcVar27 + lVar34 + 0x14);
            paVar29[-1].p[3][1] = 5.39014750168591e-318;
            image_u8_draw_line(piVar20,fVar45,fVar41,fVar42,fVar1,iVar38,1);
            fVar45 = *(float *)(pcVar27 + lVar34 + 0x10);
            fVar41 = *(float *)(pcVar27 + lVar34 + 0x14);
            fVar42 = *(float *)(pcVar27 + lVar34 + 0x18);
            fVar1 = *(float *)(pcVar27 + lVar34 + 0x1c);
            paVar29[-1].p[3][1] = 5.39036489057008e-318;
            image_u8_draw_line(piVar20,fVar45,fVar41,fVar42,fVar1,iVar38,1);
            fVar45 = *(float *)(pcVar27 + lVar34 + 0x18);
            fVar41 = *(float *)(pcVar27 + lVar34 + 0x1c);
            fVar42 = *(float *)(pcVar27 + lVar34);
            fVar1 = *(float *)(pcVar27 + lVar34 + 4);
            paVar29[-1].p[3][1] = 5.39058227945426e-318;
            image_u8_draw_line(piVar20,fVar45,fVar41,fVar42,fVar1,iVar38,1);
            lVar32 = lVar32 + 1;
          } while (lVar32 < local_38->size);
        }
        paVar29[-1].p[3][1] = 5.3907552024303e-318;
        image_u8_write_pnm(piVar20,"debug_quads_fixed.pnm");
        paVar29[-1].p[3][1] = 5.39079472768197e-318;
        image_u8_destroy(piVar20);
        td = local_80;
      }
      ptVar11 = td->tp;
      local_58 = 0x74;
      uStack_68._0_1_ = 'd';
      uStack_68._1_1_ = 'e';
      uStack_68._2_1_ = 'c';
      uStack_68._3_1_ = 'o';
      uStack_68._4_1_ = 'd';
      uStack_68._5_1_ = 'e';
      uStack_68._6_1_ = '+';
      uStack_68._7_1_ = 'r';
      det0 = (apriltag_detection_t *)0x6e656d656e696665;
      uStack_50 = 0;
      paVar29[-1].p[3][1] = 5.39100223525322e-318;
      local_48 = utime_now();
      pzVar28 = local_78;
      pzVar21 = ptVar11->stamps;
      if (pzVar21 != (zarray_t *)0x0) {
        iVar38 = pzVar21->size;
        iVar17 = pzVar21->alloc;
        if (iVar38 < iVar17) {
          pcVar27 = pzVar21->data;
        }
        else {
          do {
            bVar14 = iVar17 < 4;
            iVar17 = iVar17 * 2;
            if (bVar14) {
              iVar17 = 8;
            }
          } while (iVar17 <= iVar38);
          pzVar21->alloc = iVar17;
          pcVar27 = pzVar21->data;
          sVar12 = pzVar21->el_sz;
          paVar29[-1].p[3][1] = 5.39136784383114e-318;
          pcVar27 = (char *)realloc(pcVar27,(long)iVar17 * sVar12);
          pzVar21->data = pcVar27;
          iVar38 = pzVar21->size;
        }
        sVar13 = pzVar21->el_sz;
        paVar29[-1].p[3][1] = 5.39151112286844e-318;
        memcpy(pcVar27 + (long)iVar38 * sVar13,&uStack_68,sVar13);
        pzVar21->size = pzVar21->size + 1;
        paVar29[-1].p[3][1] = 5.3915753514024e-318;
        pzVar21 = g2d_polygon_create_zeros(4);
        paVar29[-1].p[3][1] = 5.39163957993636e-318;
        polyb = g2d_polygon_create_zeros(4);
        if (0 < pzVar28->size) {
          pmVar23 = (matd_t *)0x0;
          auStack_c8._16_8_ = pzVar21;
          do {
            uVar16 = auStack_c8._16_8_;
            if ((int)pmVar23 < 0) {
LAB_0010b2f6:
              paVar29[-1].p[3][1] = 5.40715818187223e-318;
              __assert_fail("idx >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                            ,199,"void zarray_get(const zarray_t *, int, void *)");
            }
            auStack_c8._8_8_ = (ulong)pmVar23 & 0xffffffff;
            sVar13 = pzVar28->el_sz;
            lVar32 = sVar13 * auStack_c8._8_8_;
            pcVar27 = pzVar28->data;
            local_b0 = pmVar23;
            paVar29[-1].p[3][1] = 5.39198542588844e-318;
            memcpy(&uStack_68,pcVar27 + lVar32,sVar13);
            if ((zarray_t *)uVar16 == (zarray_t *)0x0) {
LAB_0010b315:
              paVar29[-1].p[3][1] = 5.40731134222244e-318;
              __assert_fail("za != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                            ,0x155,"void zarray_set(zarray_t *, int, const void *, void *)");
            }
            local_40[0] = (char)uStack_68;
            local_40[1] = uStack_68._1_1_;
            local_40[2] = uStack_68._2_1_;
            local_40[3] = uStack_68._3_1_;
            local_40[4] = uStack_68._4_1_;
            local_40[5] = uStack_68._5_1_;
            local_40[6] = uStack_68._6_1_;
            local_40[7] = uStack_68._7_1_;
            __src_00 = (void *)((long)uStack_68 + 0x30);
            lVar32 = 0;
            do {
              if (*(int *)(uVar16 + 8) <= lVar32) {
LAB_0010b2d7:
                paVar29[-1].p[3][1] = 5.40700502152202e-318;
                __assert_fail("idx < za->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                              ,0x158,"void zarray_set(zarray_t *, int, const void *, void *)");
              }
              sVar13 = *(size_t *)uVar16;
              pcVar27 = *(char **)(uVar16 + 0x10);
              paVar29[-1].p[3][1] = 5.39228680593241e-318;
              memcpy(pcVar27 + sVar13 * lVar32,__src_00,sVar13);
              lVar32 = lVar32 + 1;
              __src_00 = (void *)((long)__src_00 + 0x10);
            } while (lVar32 != 4);
            uVar26 = (int)local_b0 + 1;
            uVar37 = pzVar28->size;
            pmVar23 = local_b0;
            local_a4 = uVar26;
            if ((int)uVar26 < (int)uVar37) {
              do {
                if ((int)pmVar23 < -1) goto LAB_0010b2f6;
                det1 = (apriltag_detection_t *)(ulong)uVar26;
                sVar13 = pzVar28->el_sz;
                lVar32 = sVar13 * (long)det1;
                pcVar27 = pzVar28->data;
                local_90 = pmVar23;
                paVar29[-1].p[3][1] = 5.39275616829596e-318;
                memcpy(&local_a0,pcVar27 + lVar32,sVar13);
                paVar33 = local_a0;
                if ((*(int *)((long)local_40 + 8) == local_a0->id) &&
                   (*(apriltag_family_t **)local_40 == local_a0->family)) {
                  if (polyb == (zarray_t *)0x0) goto LAB_0010b315;
                  __src = local_a0->p;
                  lVar32 = 0;
                  do {
                    if (polyb->size <= lVar32) goto LAB_0010b2d7;
                    sVar13 = polyb->el_sz;
                    pcVar27 = polyb->data;
                    paVar29[-1].p[3][1] = 5.39322553065951e-318;
                    memcpy(pcVar27 + sVar13 * lVar32,__src,sVar13);
                    uVar16 = auStack_c8._16_8_;
                    lVar32 = lVar32 + 1;
                    __src = __src + 1;
                  } while (lVar32 != 4);
                  paVar29[-1].p[3][1] = 5.39336386904034e-318;
                  iVar38 = g2d_polygon_overlaps_polygon((zarray_t *)uVar16,polyb);
                  acVar40 = local_40;
                  pzVar28 = local_78;
                  if (iVar38 == 0) {
                    uVar37 = local_78->size;
                    goto LAB_0010a7ce;
                  }
                  uVar37 = (uint)(paVar33->hamming < *(int *)((long)local_40 + 0xc));
                  if (*(int *)((long)local_40 + 0xc) < paVar33->hamming) {
                    uVar37 = 0xffffffff;
                  }
                  if (uVar37 == 0) {
                    uVar37 = 0xffffffff;
                    if (*(float *)((long)local_40 + 0x10) <= paVar33->decision_margin) {
                      uVar37 = (uint)(*(float *)((long)local_40 + 0x10) < paVar33->decision_margin);
                    }
                  }
                  lVar32 = 0x38;
                  do {
                    if (uVar37 == 0) {
                      dVar15 = *(double *)((long)local_40 + -8 + lVar32);
                      dVar44 = *(double *)((long)paVar33->c + lVar32 + -0x28);
                      uVar37 = 0xffffffff;
                      if ((dVar44 <= dVar15) && (uVar37 = 1, dVar15 <= dVar44)) {
                        dVar15 = *(double *)((long)paVar33->c + lVar32 + -0x20);
                        uVar37 = 0xffffffff;
                        if (dVar15 <= *(double *)((long)local_40 + lVar32)) {
                          uVar37 = (uint)(dVar15 < *(double *)((long)local_40 + lVar32));
                        }
                      }
                    }
                    lVar32 = lVar32 + 0x10;
                  } while (lVar32 != 0x78);
                  if (uVar37 == 0) {
                    paVar29[-1].p[3][1] = 5.39493993845057e-318;
                    puts("uh oh, no preference for overlappingdetection");
LAB_0010a96c:
                    paVar29[-1].p[3][1] = 5.39497946370224e-318;
                    apriltag_detection_destroy((apriltag_detection_t *)acVar40);
                    pmVar23 = local_b0;
                    if (pzVar28->size <= (int)(uint)local_b0) {
LAB_0010b334:
                      paVar29[-1].p[3][1] = 5.40746450257265e-318;
                      __assert_fail("idx < za->size",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                                    ,0x102,"void zarray_remove_index(zarray_t *, int, int)");
                    }
                    uVar37 = pzVar28->size - 1;
                    if ((uint)local_b0 < uVar37) {
                      sVar13 = pzVar28->el_sz;
                      pcVar27 = pzVar28->data;
                      lVar32 = auStack_c8._8_8_ * sVar13;
                      paVar29[-1].p[3][1] = 5.39529566571558e-318;
                      memcpy(pcVar27 + lVar32,pcVar27 + uVar37 * sVar13,sVar13);
                      uVar37 = pzVar28->size - 1;
                    }
                    pzVar28->size = uVar37;
                    goto LAB_0010a94e;
                  }
                  if (-1 < (int)uVar37) goto LAB_0010a96c;
                  paVar29[-1].p[3][1] = 5.39429271245452e-318;
                  apriltag_detection_destroy(paVar33);
                  if (pzVar28->size <= (int)uVar26) goto LAB_0010b334;
                  uVar37 = pzVar28->size - 1;
                  if (uVar26 < uVar37) {
                    sVar13 = pzVar28->el_sz;
                    pcVar27 = pzVar28->data;
                    lVar32 = (long)det1 * sVar13;
                    paVar29[-1].p[3][1] = 5.39457432987265e-318;
                    memcpy(pcVar27 + lVar32,pcVar27 + uVar37 * sVar13,sVar13);
                    uVar37 = pzVar28->size - 1;
                  }
                  pzVar28->size = uVar37;
                  pmVar23 = local_90;
                }
                else {
LAB_0010a7ce:
                  pmVar23 = (matd_t *)(ulong)uVar26;
                }
                uVar26 = (int)pmVar23 + 1;
              } while ((int)uVar26 < (int)uVar37);
            }
            pmVar23 = (matd_t *)(ulong)local_a4;
LAB_0010a94e:
            pzVar21 = (zarray_t *)auStack_c8._16_8_;
          } while ((int)pmVar23 < (int)uVar37);
        }
        if (pzVar21 != (zarray_t *)0x0) {
          pcVar27 = pzVar21->data;
          if (pcVar27 != (char *)0x0) {
            paVar29[-1].p[3][1] = 5.39545870737871e-318;
            free(pcVar27);
          }
          paVar29[-1].p[3][1] = 5.39549823263038e-318;
          free(pzVar21);
        }
        if (polyb != (zarray_t *)0x0) {
          pcVar27 = polyb->data;
          if (pcVar27 != (char *)0x0) {
            paVar29[-1].p[3][1] = 5.39559210510309e-318;
            free(pcVar27);
          }
          paVar29[-1].p[3][1] = 5.39563163035475e-318;
          free(polyb);
        }
        paVar35 = local_80;
        ptVar11 = local_80->tp;
        local_58 = 0;
        uStack_68._0_1_ = 'r';
        uStack_68._1_1_ = 'e';
        uStack_68._2_1_ = 'c';
        uStack_68._3_1_ = 'o';
        uStack_68._4_1_ = 'n';
        uStack_68._5_1_ = 'c';
        uStack_68._6_1_ = 'i';
        uStack_68._7_1_ = 'l';
        det0 = (apriltag_detection_t *)0x65;
        uStack_50 = 0;
        paVar29[-1].p[3][1] = 5.39584901923892e-318;
        local_48 = utime_now();
        pzVar28 = local_38;
        piVar20 = local_88;
        pzVar21 = ptVar11->stamps;
        if (pzVar21 != (zarray_t *)0x0) {
          iVar38 = pzVar21->size;
          iVar17 = pzVar21->alloc;
          if (iVar38 < iVar17) {
            pcVar27 = pzVar21->data;
          }
          else {
            do {
              bVar14 = iVar17 < 4;
              iVar17 = iVar17 * 2;
              if (bVar14) {
                iVar17 = 8;
              }
            } while (iVar17 <= iVar38);
            pzVar21->alloc = iVar17;
            pcVar27 = pzVar21->data;
            sVar12 = pzVar21->el_sz;
            paVar29[-1].p[3][1] = 5.39623439044268e-318;
            pcVar27 = (char *)realloc(pcVar27,(long)iVar17 * sVar12);
            pzVar21->data = pcVar27;
            iVar38 = pzVar21->size;
          }
          sVar13 = pzVar21->el_sz;
          paVar29[-1].p[3][1] = 5.39637766947997e-318;
          memcpy(pcVar27 + (long)iVar38 * sVar13,&uStack_68,sVar13);
          pzVar21->size = pzVar21->size + 1;
          if (paVar35->debug != 0) {
            paVar29[-1].p[3][1] = 5.39649130457852e-318;
            piVar20 = image_u8_copy(piVar20);
            paVar29[-1].p[3][1] = 5.39654565179956e-318;
            image_u8_darken(piVar20);
            paVar29[-1].p[3][1] = 5.39658517705123e-318;
            image_u8_darken(piVar20);
            paVar29[-1].p[3][1] = 5.39667904952394e-318;
            __stream = fopen("debug_output.ps","w");
            paVar29[-1].p[3][1] = 5.3967778626531e-318;
            fprintf(__stream,"%%!PS\n\n");
            dVar15 = 612.0 / (double)piVar20->width;
            dVar43 = 792.0 / (double)piVar20->height;
            dVar44 = dVar43;
            if (dVar15 <= dVar43) {
              dVar44 = dVar15;
            }
            uVar31 = ~-(ulong)NAN(dVar15) & (ulong)dVar44 | -(ulong)NAN(dVar15) & (ulong)dVar43;
            paVar29[-1].p[3][1] = 5.39722746239082e-318;
            fprintf(__stream,"%f %f scale\n",uVar31,(int)uVar31);
            uVar37 = piVar20->height;
            paVar29[-1].p[3][1] = 5.39733121617645e-318;
            fprintf(__stream,"0 %d translate\n",(ulong)uVar37);
            paVar29[-1].p[3][1] = 5.39745473258791e-318;
            fwrite("1 -1 scale\n",0xb,1,__stream);
            paVar29[-1].p[3][1] = 5.39750907980895e-318;
            postscript_image((FILE *)__stream,piVar20);
            paVar29[-1].p[3][1] = 5.39754860506062e-318;
            image_u8_destroy(piVar20);
            if (0 < local_78->size) {
              lVar32 = 0;
              do {
                sVar13 = local_78->el_sz;
                pcVar27 = local_78->data;
                paVar29[-1].p[3][1] = 5.39784504444812e-318;
                memcpy(&local_a0,pcVar27 + sVar13 * lVar32,sVar13);
                lVar22 = 0;
                do {
                  paVar29[-1].p[3][1] = 5.39788456969979e-318;
                  lVar34 = random();
                  *(float *)((long)&uStack_68 + lVar22 * 4) = (float)(lVar34 % 0x9b + 100);
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 3);
                fVar45 = (float)uStack_68 / 255.0;
                fVar41 = uStack_68._4_4_ / 255.0;
                fVar42 = det0._0_4_ / 255.0;
                paVar29[-1].p[3][1] = 5.39850215175709e-318;
                fprintf(__stream,"%f %f %f setrgbcolor\n",(double)fVar45,SUB84((double)fVar41,0),
                        (double)fVar42);
                dVar15 = local_a0->p[0][0];
                dVar44 = local_a0->p[0][1];
                dVar43 = local_a0->p[1][0];
                dVar6 = local_a0->p[1][1];
                dVar7 = local_a0->p[2][0];
                dVar8 = local_a0->p[2][1];
                dVar9 = local_a0->p[3][0];
                dVar10 = local_a0->p[3][1];
                paVar29[-1].p[3][1] = dVar44;
                paVar29[-1].p[3][0] = dVar15;
                paVar29[-1].p[2][1] = 5.39887270099147e-318;
                fprintf(__stream,
                        "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                        dVar15,SUB84(dVar44,0),dVar43,SUB84(dVar6,0),dVar7,dVar8,dVar9,dVar10);
                lVar32 = lVar32 + 1;
              } while (lVar32 < local_78->size);
            }
            paVar29[-1].p[3][1] = 5.39911479315793e-318;
            fwrite("showpage\n",9,1,__stream);
            paVar29[-1].p[3][1] = 5.3991543184096e-318;
            fclose(__stream);
            piVar20 = local_88;
            paVar35 = local_80;
            pzVar28 = local_38;
            if (local_80->debug != 0) {
              paVar29[-1].p[3][1] = 5.39931241941627e-318;
              piVar24 = image_u8_copy(piVar20);
              paVar29[-1].p[3][1] = 5.39936676663731e-318;
              image_u8_darken(piVar24);
              paVar29[-1].p[3][1] = 5.39940629188898e-318;
              image_u8_darken(piVar24);
              uVar37 = piVar24->width;
              uVar26 = piVar24->height;
              paVar29[-1].p[3][1] = 5.39946557976648e-318;
              im = image_u8x3_create(uVar37,uVar26);
              iVar38 = piVar20->height;
              if (0 < iVar38) {
                iVar17 = piVar20->width;
                iVar36 = 0;
                do {
                  if (0 < iVar17) {
                    lVar32 = 2;
                    lVar22 = (long)iVar36;
                    lVar34 = 0;
                    do {
                      im->buf[lVar32 + -2 + im->stride * lVar22] =
                           piVar24->buf[lVar34 + piVar24->stride * lVar22];
                      im->buf[lVar32 + -1 + im->stride * lVar22] =
                           piVar24->buf[lVar34 + piVar24->stride * lVar22];
                      im->buf[lVar32 + im->stride * lVar22] =
                           piVar24->buf[lVar34 + piVar24->stride * lVar22];
                      iVar17 = piVar20->width;
                      lVar34 = lVar34 + 1;
                      lVar32 = lVar32 + 3;
                    } while ((int)lVar34 < iVar17);
                    iVar38 = piVar20->height;
                  }
                  iVar36 = iVar36 + 1;
                } while (iVar36 < iVar38);
              }
              if (0 < local_78->size) {
                paVar33 = (apriltag_detection_t *)0x0;
                do {
                  sVar13 = local_78->el_sz;
                  pcVar27 = local_78->data;
                  det1 = paVar33;
                  paVar29[-1].p[3][1] = 5.40054758353087e-318;
                  memcpy(&local_a0,pcVar27 + sVar13 * (long)paVar33,sVar13);
                  lVar32 = 0;
                  do {
                    paVar29[-1].p[3][1] = 5.40058710878254e-318;
                    lVar22 = random();
                    paVar33 = local_a0;
                    *(float *)((long)&uStack_68 + lVar32 * 4) = (float)(lVar22 % 0x9b + 100);
                    lVar32 = lVar32 + 1;
                  } while (lVar32 != 3);
                  iVar38 = (int)(float)uStack_68;
                  local_40[0] = (char)iVar38;
                  local_40[1] = (char)((uint)iVar38 >> 8);
                  local_40[2] = (char)((uint)iVar38 >> 0x10);
                  local_40[3] = (char)((uint)iVar38 >> 0x18);
                  local_90 = (matd_t *)CONCAT44(local_90._4_4_,(int)uStack_68._4_4_);
                  iVar38 = (int)det0._0_4_;
                  pdVar39 = local_a0->p[0] + 1;
                  lVar32 = 1;
                  do {
                    dVar15 = (*(double (*) [2])(pdVar39 + -1))[0];
                    dVar44 = *pdVar39;
                    uVar31 = (ulong)(((uint)lVar32 & 3) << 4);
                    dVar43 = *(double *)((long)paVar33->p[0] + uVar31);
                    dVar6 = *(double *)((long)paVar33->p[0] + uVar31 + 8);
                    local_6b = local_40[0];
                    local_6a = SUB81(local_90,0);
                    local_69 = (undefined1)iVar38;
                    paVar29[-1].p[3][1] = 5.40151595219672e-318;
                    image_u8x3_draw_line
                              (im,(float)dVar15,(float)dVar44,(float)dVar43,(float)dVar6,&local_6b,1
                              );
                    pdVar39 = pdVar39 + 2;
                    lVar32 = lVar32 + 1;
                  } while (lVar32 != 5);
                  paVar33 = (apriltag_detection_t *)((long)&det1->family + 1);
                } while ((long)paVar33 < (long)local_78->size);
              }
              paVar29[-1].p[3][1] = 5.40183709486652e-318;
              image_u8x3_write_pnm(im,"debug_output.pnm");
              paVar29[-1].p[3][1] = 5.40187662011819e-318;
              image_u8x3_destroy(im);
              pzVar28 = local_38;
              piVar20 = local_88;
              paVar35 = local_80;
              if (local_80->debug != 0) {
                paVar29[-1].p[3][1] = 5.4020890683459e-318;
                acVar40 = (char  [8])fopen("debug_quads.ps","w");
                paVar29[-1].p[3][1] = 5.40218788147507e-318;
                fprintf((FILE *)acVar40,"%%!PS\n\n");
                paVar29[-1].p[3][1] = 5.40222740672673e-318;
                piVar20 = image_u8_copy(piVar20);
                paVar29[-1].p[3][1] = 5.40228175394778e-318;
                image_u8_darken(piVar20);
                paVar29[-1].p[3][1] = 5.40232127919944e-318;
                image_u8_darken(piVar20);
                dVar43 = 612.0 / (double)piVar20->width;
                dVar15 = 792.0 / (double)piVar20->height;
                dVar44 = dVar15;
                if (dVar43 <= dVar15) {
                  dVar44 = dVar43;
                }
                uVar31 = ~-(ulong)NAN(dVar43) & (ulong)dVar44 | -(ulong)NAN(dVar43) & (ulong)dVar15;
                paVar29[-1].p[3][1] = 5.40277087893716e-318;
                fprintf((FILE *)acVar40,"%f %f scale\n",uVar31,(int)uVar31);
                uVar37 = piVar20->height;
                paVar29[-1].p[3][1] = 5.40287463272279e-318;
                fprintf((FILE *)acVar40,"0 %d translate\n",(ulong)uVar37);
                paVar29[-1].p[3][1] = 5.40299814913425e-318;
                fwrite("1 -1 scale\n",0xb,1,(FILE *)acVar40);
                local_40 = acVar40;
                paVar29[-1].p[3][1] = 5.40307225898112e-318;
                postscript_image((FILE *)acVar40,piVar20);
                paVar29[-1].p[3][1] = 5.40311178423279e-318;
                image_u8_destroy(piVar20);
                if (0 < pzVar28->size) {
                  lVar32 = 0;
                  do {
                    pcVar27 = pzVar28->data;
                    lVar34 = pzVar28->el_sz * lVar32;
                    lVar22 = 0;
                    do {
                      paVar29[-1].p[3][1] = 5.40333411377342e-318;
                      lVar25 = random();
                      acVar40 = local_40;
                      *(float *)((long)&uStack_68 + lVar22 * 4) = (float)(lVar25 % 0x9b + 100);
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 3);
                    fVar45 = (float)uStack_68 / 255.0;
                    fVar41 = uStack_68._4_4_ / 255.0;
                    fVar42 = det0._0_4_ / 255.0;
                    paVar29[-1].p[3][1] = 5.40396651780009e-318;
                    fprintf((FILE *)acVar40,"%f %f %f setrgbcolor\n",(double)fVar45,
                            SUB84((double)fVar41,0),(double)fVar42);
                    fVar45 = *(float *)(pcVar27 + lVar34);
                    fVar41 = *(float *)(pcVar27 + lVar34 + 4);
                    fVar42 = *(float *)(pcVar27 + lVar34 + 8);
                    fVar1 = *(float *)(pcVar27 + lVar34 + 0xc);
                    fVar2 = *(float *)(pcVar27 + lVar34 + 0x10);
                    fVar3 = *(float *)(pcVar27 + lVar34 + 0x14);
                    fVar4 = *(float *)(pcVar27 + lVar34 + 0x18);
                    fVar5 = *(float *)(pcVar27 + lVar34 + 0x1c);
                    paVar29[-1].p[3][1] = (double)fVar41;
                    paVar29[-1].p[3][0] = (double)fVar45;
                    paVar29[-1].p[2][1] = 5.40451493066698e-318;
                    fprintf((FILE *)acVar40,
                            "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n"
                            ,(double)fVar45,SUB84((double)fVar41,0),(double)fVar42,
                            SUB84((double)fVar1,0),(double)fVar2,(double)fVar3,(double)fVar4,
                            (double)fVar5);
                    lVar32 = lVar32 + 1;
                    pzVar28 = local_38;
                  } while (lVar32 < local_38->size);
                }
                acVar40 = local_40;
                paVar29[-1].p[3][1] = 5.40477678545927e-318;
                fwrite("showpage\n",9,1,(FILE *)acVar40);
                paVar29[-1].p[3][1] = 5.40481631071094e-318;
                fclose((FILE *)acVar40);
                paVar35 = local_80;
              }
            }
          }
          ptVar11 = paVar35->tp;
          local_58 = 0;
          uStack_68._0_1_ = 'd';
          uStack_68._1_1_ = 'e';
          uStack_68._2_1_ = 'b';
          uStack_68._3_1_ = 'u';
          uStack_68._4_1_ = 'g';
          uStack_68._5_1_ = ' ';
          uStack_68._6_1_ = 'o';
          uStack_68._7_1_ = 'u';
          det0 = (apriltag_detection_t *)0x74757074;
          uStack_50 = 0;
          paVar29[-1].p[3][1] = 5.40503864025157e-318;
          local_48 = utime_now();
          pzVar21 = ptVar11->stamps;
          if (pzVar21 != (zarray_t *)0x0) {
            iVar38 = pzVar21->size;
            iVar17 = pzVar21->alloc;
            if (iVar38 < iVar17) {
              pcVar27 = pzVar21->data;
            }
            else {
              do {
                bVar14 = iVar17 < 4;
                iVar17 = iVar17 * 2;
                if (bVar14) {
                  iVar17 = 8;
                }
              } while (iVar17 <= iVar38);
              pzVar21->alloc = iVar17;
              pcVar27 = pzVar21->data;
              sVar12 = pzVar21->el_sz;
              paVar29[-1].p[3][1] = 5.40538448620366e-318;
              pcVar27 = (char *)realloc(pcVar27,(long)iVar17 * sVar12);
              pzVar21->data = pcVar27;
              iVar38 = pzVar21->size;
            }
            sVar13 = pzVar21->el_sz;
            paVar29[-1].p[3][1] = 5.40552776524095e-318;
            memcpy(pcVar27 + (long)iVar38 * sVar13,&uStack_68,sVar13);
            pzVar21->size = pzVar21->size + 1;
            if (0 < pzVar28->size) {
              lVar32 = 0;
              do {
                pcVar27 = pzVar28->data;
                lVar22 = pzVar28->el_sz * lVar32;
                pmVar23 = *(matd_t **)(pcVar27 + lVar22 + 0x28);
                paVar29[-1].p[3][1] = 5.40569574756054e-318;
                matd_destroy(pmVar23);
                pmVar23 = *(matd_t **)(pcVar27 + lVar22 + 0x30);
                paVar29[-1].p[3][1] = 5.40574515412512e-318;
                matd_destroy(pmVar23);
                lVar32 = lVar32 + 1;
              } while (lVar32 < pzVar28->size);
            }
            pcVar27 = pzVar28->data;
            if (pcVar27 != (char *)0x0) {
              paVar29[-1].p[3][1] = 5.40587361119304e-318;
              free(pcVar27);
            }
            paVar29[-1].p[3][1] = 5.40591313644471e-318;
            free(pzVar28);
            pzVar21 = local_78;
            iVar38 = local_78->size;
            if ((long)iVar38 != 0) {
              sVar13 = local_78->el_sz;
              pcVar27 = local_78->data;
              paVar29[-1].p[3][1] = 5.40607123745138e-318;
              qsort(pcVar27,(long)iVar38,sVar13,detection_compare_function);
            }
            ptVar11 = paVar35->tp;
            local_58 = 0;
            uStack_68._0_1_ = 'c';
            uStack_68._1_1_ = 'l';
            uStack_68._2_1_ = 'e';
            uStack_68._3_1_ = 'a';
            uStack_68._4_1_ = 'n';
            uStack_68._5_1_ = 'u';
            uStack_68._6_1_ = 'p';
            uStack_68._7_1_ = '\0';
            det0 = (apriltag_detection_t *)0x0;
            uStack_50 = 0;
            paVar29[-1].p[3][1] = 5.4062589823968e-318;
            local_48 = utime_now();
            pzVar28 = ptVar11->stamps;
            if (pzVar28 != (zarray_t *)0x0) {
              iVar38 = pzVar28->size;
              iVar17 = pzVar28->alloc;
              if (iVar38 < iVar17) {
                pcVar27 = pzVar28->data;
              }
              else {
                do {
                  bVar14 = iVar17 < 4;
                  iVar17 = iVar17 * 2;
                  if (bVar14) {
                    iVar17 = 8;
                  }
                } while (iVar17 <= iVar38);
                pzVar28->alloc = iVar17;
                pcVar27 = pzVar28->data;
                sVar12 = pzVar28->el_sz;
                paVar29[-1].p[3][1] = 5.40660482834889e-318;
                pcVar27 = (char *)realloc(pcVar27,(long)iVar17 * sVar12);
                pzVar28->data = pcVar27;
                iVar38 = pzVar28->size;
              }
              sVar13 = pzVar28->el_sz;
              paVar29[-1].p[3][1] = 5.40674810738618e-318;
              memcpy(pcVar27 + (long)iVar38 * sVar13,&uStack_68,sVar13);
              pzVar28->size = pzVar28->size + 1;
              return pzVar21;
            }
          }
        }
      }
    }
  }
LAB_0010b353:
  paVar29[-1].p[3][1] = 5.40761766292286e-318;
  __assert_fail("za != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                ,0xb5,"void zarray_add(zarray_t *, const void *)");
}

Assistant:

zarray_t *apriltag_detector_detect(apriltag_detector_t *td, image_u8_t *im_orig)
{
    if (zarray_size(td->tag_families) == 0) {
        zarray_t *s = zarray_create(sizeof(apriltag_detection_t*));
        printf("apriltag.c: No tag families enabled.");
        return s;
    }

    if (td->wp == NULL || td->nthreads != workerpool_get_nthreads(td->wp)) {
        workerpool_destroy(td->wp);
        td->wp = workerpool_create(td->nthreads);
    }

    timeprofile_clear(td->tp);
    timeprofile_stamp(td->tp, "init");

    ///////////////////////////////////////////////////////////
    // Step 1. Detect quads according to requested image decimation
    // and blurring parameters.
    image_u8_t *quad_im = im_orig;
    if (td->quad_decimate > 1) {
        quad_im = image_u8_decimate(im_orig, td->quad_decimate);

        timeprofile_stamp(td->tp, "decimate");
    }

    if (td->quad_sigma != 0) {
        // compute a reasonable kernel width by figuring that the
        // kernel should go out 2 std devs.
        //
        // max sigma          ksz
        // 0.499              1  (disabled)
        // 0.999              3
        // 1.499              5
        // 1.999              7

        float sigma = fabsf((float) td->quad_sigma);

        int ksz = 4 * sigma; // 2 std devs in each direction
        if ((ksz & 1) == 0)
            ksz++;

        if (ksz > 1) {

            if (td->quad_sigma > 0) {
                // Apply a blur
                image_u8_gaussian_blur(quad_im, sigma, ksz);
            } else {
                // SHARPEN the image by subtracting the low frequency components.
                image_u8_t *orig = image_u8_copy(quad_im);
                image_u8_gaussian_blur(quad_im, sigma, ksz);

                for (int y = 0; y < orig->height; y++) {
                    for (int x = 0; x < orig->width; x++) {
                        int vorig = orig->buf[y*orig->stride + x];
                        int vblur = quad_im->buf[y*quad_im->stride + x];

                        int v = 2*vorig - vblur;
                        if (v < 0)
                            v = 0;
                        if (v > 255)
                            v = 255;

                        quad_im->buf[y*quad_im->stride + x] = (uint8_t) v;
                    }
                }
                image_u8_destroy(orig);
            }
        }
    }

    timeprofile_stamp(td->tp, "blur/sharp");

    if (td->debug)
        image_u8_write_pnm(quad_im, "debug_preprocess.pnm");

    zarray_t *quads = apriltag_quad_thresh(td, quad_im);
    
    // adjust centers of pixels so that they correspond to the
    // original full-resolution image.
    if (td->quad_decimate > 1) {
        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *q;
            zarray_get_volatile(quads, i, &q);

            for (int i = 0; i < 4; i++) {
                if (td->quad_decimate == 1.5) {
                    q->p[i][0] *= td->quad_decimate;
                    q->p[i][1] *= td->quad_decimate;
                } else {
                    q->p[i][0] = (q->p[i][0] - 0.5)*td->quad_decimate + 0.5;
                    q->p[i][1] = (q->p[i][1] - 0.5)*td->quad_decimate + 0.5;
                }
            }
        }
    }

    if (quad_im != im_orig)
        image_u8_destroy(quad_im);

    zarray_t *detections = zarray_create(sizeof(apriltag_detection_t*));

    td->nquads = zarray_size(quads);

    timeprofile_stamp(td->tp, "quads");

    if (td->debug) {
        image_u8_t *im_quads = image_u8_copy(im_orig);
        image_u8_darken(im_quads);
        image_u8_darken(im_quads);

        srandom(0);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *quad;
            zarray_get_volatile(quads, i, &quad);

            const int bias = 100;
            int color = bias + (random() % (255-bias));

            image_u8_draw_line(im_quads, quad->p[0][0], quad->p[0][1], quad->p[1][0], quad->p[1][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[1][0], quad->p[1][1], quad->p[2][0], quad->p[2][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[2][0], quad->p[2][1], quad->p[3][0], quad->p[3][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[3][0], quad->p[3][1], quad->p[0][0], quad->p[0][1], color, 1);
        }

        image_u8_write_pnm(im_quads, "debug_quads_raw.pnm");
        image_u8_destroy(im_quads);
    }

    ////////////////////////////////////////////////////////////////
    // Step 2. Decode tags from each quad.
    if (1) {
        image_u8_t *im_samples = td->debug ? image_u8_copy(im_orig) : NULL;

        int chunksize = 1 + zarray_size(quads) / (APRILTAG_TASKS_PER_THREAD_TARGET * td->nthreads);

        struct quad_decode_task tasks[zarray_size(quads) / chunksize + 1];

        int ntasks = 0;
        for (int i = 0; i < zarray_size(quads); i+= chunksize) {
            tasks[ntasks].i0 = i;
            tasks[ntasks].i1 = imin(zarray_size(quads), i + chunksize);
            tasks[ntasks].quads = quads;
            tasks[ntasks].td = td;
            tasks[ntasks].im = im_orig;
            tasks[ntasks].detections = detections;

            tasks[ntasks].im_samples = im_samples;

            workerpool_add_task(td->wp, quad_decode_task, &tasks[ntasks]);
            ntasks++;
        }

        workerpool_run(td->wp);

        if (im_samples != NULL) {
            image_u8_write_pnm(im_samples, "debug_samples.pnm");
            image_u8_destroy(im_samples);
        }
    }

    if (td->debug) {
        image_u8_t *im_quads = image_u8_copy(im_orig);
        image_u8_darken(im_quads);
        image_u8_darken(im_quads);

        srandom(0);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *quad;
            zarray_get_volatile(quads, i, &quad);

            const int bias = 100;
            int color = bias + (random() % (255-bias));

            image_u8_draw_line(im_quads, quad->p[0][0], quad->p[0][1], quad->p[1][0], quad->p[1][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[1][0], quad->p[1][1], quad->p[2][0], quad->p[2][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[2][0], quad->p[2][1], quad->p[3][0], quad->p[3][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[3][0], quad->p[3][1], quad->p[0][0], quad->p[0][1], color, 1);

        }

        image_u8_write_pnm(im_quads, "debug_quads_fixed.pnm");
        image_u8_destroy(im_quads);
    }

    timeprofile_stamp(td->tp, "decode+refinement");

    ////////////////////////////////////////////////////////////////
    // Step 3. Reconcile detections--- don't report the same tag more
    // than once. (Allow non-overlapping duplicate detections.)
    if (1) {
        zarray_t *poly0 = g2d_polygon_create_zeros(4);
        zarray_t *poly1 = g2d_polygon_create_zeros(4);

        for (int i0 = 0; i0 < zarray_size(detections); i0++) {

            apriltag_detection_t *det0;
            zarray_get(detections, i0, &det0);

            for (int k = 0; k < 4; k++)
                zarray_set(poly0, k, det0->p[k], NULL);

            for (int i1 = i0+1; i1 < zarray_size(detections); i1++) {

                apriltag_detection_t *det1;
                zarray_get(detections, i1, &det1);

                if (det0->id != det1->id || det0->family != det1->family)
                    continue;

                for (int k = 0; k < 4; k++)
                    zarray_set(poly1, k, det1->p[k], NULL);

                if (g2d_polygon_overlaps_polygon(poly0, poly1)) {
                    // the tags overlap. Delete one, keep the other.

                    int pref = 0; // 0 means undecided which one we'll keep.
                    pref = prefer_smaller(pref, det0->hamming, det1->hamming);     // want small hamming
                    pref = prefer_smaller(pref, -det0->decision_margin, -det1->decision_margin);      // want bigger margins

                    // if we STILL don't prefer one detection over the other, then pick
                    // any deterministic criterion.
                    for (int i = 0; i < 4; i++) {
                        pref = prefer_smaller(pref, det0->p[i][0], det1->p[i][0]);
                        pref = prefer_smaller(pref, det0->p[i][1], det1->p[i][1]);
                    }

                    if (pref == 0) {
                        // at this point, we should only be undecided if the tag detections
                        // are *exactly* the same. How would that happen?
                        printf("uh oh, no preference for overlappingdetection\n");
                    }

                    if (pref < 0) {
                        // keep det0, destroy det1
                        apriltag_detection_destroy(det1);
                        zarray_remove_index(detections, i1, 1);
                        i1--; // retry the same index
                        goto retry1;
                    } else {
                        // keep det1, destroy det0
                        apriltag_detection_destroy(det0);
                        zarray_remove_index(detections, i0, 1);
                        i0--; // retry the same index.
                        goto retry0;
                    }
                }

              retry1: ;
            }

          retry0: ;
        }

        zarray_destroy(poly0);
        zarray_destroy(poly1);
    }

    timeprofile_stamp(td->tp, "reconcile");

    ////////////////////////////////////////////////////////////////
    // Produce final debug output
    if (td->debug) {

        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        // assume letter, which is 612x792 points.
        FILE *f = fopen("debug_output.ps", "w");
        fprintf(f, "%%!PS\n\n");
        double scale = fmin(612.0/darker->width, 792.0/darker->height);
        fprintf(f, "%f %f scale\n", scale, scale);
        fprintf(f, "0 %d translate\n", darker->height);
        fprintf(f, "1 -1 scale\n");
        postscript_image(f, darker);

        image_u8_destroy(darker);

        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            fprintf(f, "%f %f %f setrgbcolor\n", rgb[0]/255.0f, rgb[1]/255.0f, rgb[2]/255.0f);
            fprintf(f, "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                    det->p[0][0], det->p[0][1],
                    det->p[1][0], det->p[1][1],
                    det->p[2][0], det->p[2][1],
                    det->p[3][0], det->p[3][1],
                    det->p[0][0], det->p[0][1]);
        }

        fprintf(f, "showpage\n");
        fclose(f);
    }

    if (td->debug) {
        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        image_u8x3_t *out = image_u8x3_create(darker->width, darker->height);
        for (int y = 0; y < im_orig->height; y++) {
            for (int x = 0; x < im_orig->width; x++) {
                out->buf[y*out->stride + 3*x + 0] = darker->buf[y*darker->stride + x];
                out->buf[y*out->stride + 3*x + 1] = darker->buf[y*darker->stride + x];
                out->buf[y*out->stride + 3*x + 2] = darker->buf[y*darker->stride + x];
            }
        }

        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            for (int j = 0; j < 4; j++) {
                int k = (j + 1) & 3;
                image_u8x3_draw_line(out,
                                     det->p[j][0], det->p[j][1], det->p[k][0], det->p[k][1],
                                     (uint8_t[]) { rgb[0], rgb[1], rgb[2] },
                                     1);
            }
        }

        image_u8x3_write_pnm(out, "debug_output.pnm");
        image_u8x3_destroy(out);
    }

    // deallocate
    if (td->debug) {
        FILE *f = fopen("debug_quads.ps", "w");
        fprintf(f, "%%!PS\n\n");

        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        // assume letter, which is 612x792 points.
        double scale = fmin(612.0/darker->width, 792.0/darker->height);
        fprintf(f, "%f %f scale\n", scale, scale);
        fprintf(f, "0 %d translate\n", darker->height);
        fprintf(f, "1 -1 scale\n");

        postscript_image(f, darker);

        image_u8_destroy(darker);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *q;
            zarray_get_volatile(quads, i, &q);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            fprintf(f, "%f %f %f setrgbcolor\n", rgb[0]/255.0f, rgb[1]/255.0f, rgb[2]/255.0f);
            fprintf(f, "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                    q->p[0][0], q->p[0][1],
                    q->p[1][0], q->p[1][1],
                    q->p[2][0], q->p[2][1],
                    q->p[3][0], q->p[3][1],
                    q->p[0][0], q->p[0][1]);
        }

        fprintf(f, "showpage\n");
        fclose(f);
    }

    timeprofile_stamp(td->tp, "debug output");

    for (int i = 0; i < zarray_size(quads); i++) {
        struct quad *quad;
        zarray_get_volatile(quads, i, &quad);
        matd_destroy(quad->H);
        matd_destroy(quad->Hinv);
    }

    zarray_destroy(quads);

    zarray_sort(detections, detection_compare_function);
    timeprofile_stamp(td->tp, "cleanup");

    return detections;
}